

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/boolean_object.cpp:58:79)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_boolean_object_cpp:58:79)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  void *pvVar1;
  gc_heap_ptr<mjs::boolean_object> o;
  gc_heap_ptr_untyped local_48;
  undefined1 local_38 [32];
  
  make_boolean_object::anon_class_32_2_842af841::operator()
            ((anon_class_32_2_842af841 *)local_38,(value *)&this->f);
  pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_38);
  local_38._24_8_ = L"false";
  if ((ulong)*(byte *)((long)pvVar1 + 0x1d) != 0) {
    local_38._24_8_ = L"true";
  }
  local_38._16_8_ = (ulong)*(byte *)((long)pvVar1 + 0x1d) ^ 5;
  string::string((string *)&local_48,(gc_heap *)local_38._0_8_,(wstring_view *)(local_38 + 0x10));
  __return_storage_ptr__->type_ = string;
  (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
  heap_ = local_48.heap_;
  *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_48.pos_;
  if (local_48.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_48.heap_,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_48);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_38);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }